

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_version_details.c
# Opt level: O2

char * archive_version_details(void)

{
  void *p;
  void *p_00;
  void *p_01;
  
  p = (void *)zlibVersion();
  p_00 = (void *)lzma_version_string();
  p_01 = (void *)ZSTD_versionString();
  archive_version_details::str.s = (char *)0x0;
  archive_version_details::str.length = 0;
  archive_version_details::str.buffer_length = 0;
  archive_strcat(&archive_version_details::str,"libarchive 3.8.0dev");
  if (p != (void *)0x0) {
    archive_strcat(&archive_version_details::str," zlib/");
    archive_strcat(&archive_version_details::str,p);
  }
  if (p_00 != (void *)0x0) {
    archive_strcat(&archive_version_details::str," liblzma/");
    archive_strcat(&archive_version_details::str,p_00);
  }
  if (p_01 != (void *)0x0) {
    archive_strcat(&archive_version_details::str," libzstd/");
    archive_strcat(&archive_version_details::str,p_01);
  }
  archive_strcat(&archive_version_details::str," libxml2/");
  archive_strcat(&archive_version_details::str,"2.9.13");
  archive_strcat(&archive_version_details::str," openssl/");
  archive_strcat(&archive_version_details::str,"3.0.2");
  archive_strcat(&archive_version_details::str," libb2/");
  archive_strcat(&archive_version_details::str,"bundled");
  return archive_version_details::str.s;
}

Assistant:

const char *
archive_version_details(void)
{
	static struct archive_string str;
	static int init = 0;
	const char *zlib = archive_zlib_version();
	const char *liblzma = archive_liblzma_version();
	const char *bzlib = archive_bzlib_version();
	const char *liblz4 = archive_liblz4_version();
	const char *libzstd = archive_libzstd_version();
	const char *liblzo = archive_liblzo2_version();
	const char *libiconv = archive_libiconv_version();
	const char *libacl = archive_libacl_version();
	const char *librichacl = archive_librichacl_version();
	const char *libattr = archive_libacl_version();

	if (!init) {
		archive_string_init(&str);

		archive_strcat(&str, ARCHIVE_VERSION_STRING);
		if (zlib) {
			archive_strcat(&str, " zlib/");
			archive_strcat(&str, zlib);
		}
		if (liblzma) {
			archive_strcat(&str, " liblzma/");
			archive_strcat(&str, liblzma);
		}
		if (bzlib) {
			const char *p = bzlib;
			const char *sep = strchr(p, ',');
			if (sep == NULL)
				sep = p + strlen(p);
			archive_strcat(&str, " bz2lib/");
			archive_strncat(&str, p, sep - p);
		}
		if (liblz4) {
			archive_strcat(&str, " liblz4/");
			archive_strcat(&str, liblz4);
		}
		if (libzstd) {
			archive_strcat(&str, " libzstd/");
			archive_strcat(&str, libzstd);
		}
		if (liblzo) {
			archive_strcat(&str, " liblzo2/");
			archive_strcat(&str, liblzo);
		}
		archive_xml_version(&str);
		archive_regex_version(&str);
		archive_crypto_version(&str);
		archive_libb2_version(&str);
		if (librichacl) {
			archive_strcat(&str, " librichacl/");
			archive_strcat(&str, librichacl);
		}
		if (libacl) {
			archive_strcat(&str, " libacl/");
			archive_strcat(&str, libacl);
		}
		if (libattr) {
			archive_strcat(&str, " libattr/");
			archive_strcat(&str, libattr);
		}
		if (libiconv) {
			archive_strcat(&str, " libiconv/");
			archive_strcat(&str, libiconv);
		}
	}
	return str.s;
}